

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xmlreader(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  xmlParserInputBufferPtr pxVar14;
  undefined8 uVar15;
  char *pcVar16;
  ulong uVar17;
  xmlChar *pxVar18;
  char *pcVar19;
  xmlTextReaderPtr pxVar20;
  ulong uVar21;
  xmlDocPtr pxVar22;
  xmlDocPtr pxVar23;
  long lVar24;
  xmlNodePtr pxVar25;
  int extraout_EDX;
  int extraout_EDX_00;
  int nr;
  int test_ret_2;
  uint no;
  uint uVar26;
  int test_ret_4;
  undefined8 *puVar27;
  char *in_RSI;
  uint uVar28;
  int test_ret_3;
  int n_input;
  uint uVar29;
  uint uVar30;
  int local_f0;
  int local_ec;
  int test_ret_1;
  int test_ret_7;
  int local_cc;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int test_ret;
  int test_ret_6;
  int local_78;
  int test_ret_5;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int test_ret_8;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing xmlreader : 76 of 89 functions ...");
  }
  test_ret_6 = 0;
  for (uVar29 = 0; uVar29 != 8; uVar29 = uVar29 + 1) {
    pxVar23 = (xmlDocPtr)0x0;
    while (iVar4 = (int)pxVar23, iVar4 != 8) {
      iVar2 = xmlMemBlocks();
      iVar3 = (int)in_RSI;
      pxVar14 = gen_xmlParserInputBufferPtr(uVar29,iVar3);
      in_RSI = gen_filepath(iVar4,iVar3);
      uVar15 = xmlNewTextReader(pxVar14);
      xmlFreeTextReader(uVar15);
      call_tests = call_tests + 1;
      xmlFreeParserInputBuffer();
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewTextReader",(ulong)(uint)(iVar3 - iVar2));
        test_ret_6 = test_ret_6 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        in_RSI = (char *)pxVar23;
      }
      pxVar23 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar29 = 0; uVar29 != 8; uVar29 = uVar29 + 1) {
    iVar4 = xmlMemBlocks();
    pcVar16 = gen_filepath(uVar29,(int)in_RSI);
    xmlNewTextReaderFilename(pcVar16);
    xmlFreeTextReader();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar4 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewTextReaderFilename",(ulong)(uint)(iVar2 - iVar4));
      test_ret = test_ret + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_70 = 0;
  for (uVar29 = 0; uVar29 != 5; uVar29 = uVar29 + 1) {
    for (uVar28 = 0; uVar28 != 8; uVar28 = uVar28 + 1) {
      uVar17 = 0;
      while (uVar30 = (uint)uVar17, uVar30 != 4) {
        pxVar23 = (xmlDocPtr)0x0;
        while (iVar4 = (int)pxVar23, iVar4 != 5) {
          iVar2 = xmlMemBlocks();
          iVar3 = (int)in_RSI;
          pxVar18 = gen_const_xmlChar_ptr(uVar29,iVar3);
          in_RSI = gen_filepath(uVar28,iVar3);
          if (uVar30 < 3) {
            uVar15 = (&DAT_0015bd68)[uVar17];
          }
          else {
            uVar15 = 0;
          }
          iVar3 = gen_parseroptions(iVar4,iVar3);
          xmlReaderForDoc(pxVar18,in_RSI,uVar15,iVar3);
          xmlFreeTextReader();
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlReaderForDoc",(ulong)(uint)(iVar3 - iVar2));
            local_70 = local_70 + 1;
            printf(" %d",(ulong)uVar29);
            printf(" %d",(ulong)uVar28);
            printf(" %d",uVar17);
            printf(" %d");
            putchar(10);
            in_RSI = (char *)pxVar23;
          }
          pxVar23 = (xmlDocPtr)(ulong)(iVar4 + 1);
        }
        uVar17 = (ulong)(uVar30 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_78 = 0;
  for (uVar29 = 0; uVar29 != 8; uVar29 = uVar29 + 1) {
    uVar17 = 0;
    while (uVar28 = (uint)uVar17, uVar28 != 4) {
      pxVar23 = (xmlDocPtr)0x0;
      while (iVar4 = (int)pxVar23, iVar4 != 5) {
        iVar2 = xmlMemBlocks();
        iVar3 = (int)in_RSI;
        pcVar16 = gen_filepath(uVar29,iVar3);
        if (uVar28 < 3) {
          in_RSI = (char *)(&DAT_0015bd68)[uVar17];
        }
        else {
          in_RSI = (char *)0x0;
        }
        iVar3 = gen_parseroptions(iVar4,iVar3);
        xmlReaderForFile(pcVar16,in_RSI,iVar3);
        xmlFreeTextReader();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlReaderForFile",(ulong)(uint)(iVar3 - iVar2));
          local_78 = local_78 + 1;
          printf(" %d",(ulong)uVar29);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = (char *)pxVar23;
        }
        pxVar23 = (xmlDocPtr)(ulong)(iVar4 + 1);
      }
      uVar17 = (ulong)(uVar28 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_68 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    for (uVar28 = 0; uVar28 != 4; uVar28 = uVar28 + 1) {
      for (uVar30 = 0; uVar30 != 8; uVar30 = uVar30 + 1) {
        uVar17 = 0;
        while (uVar26 = (uint)uVar17, uVar26 != 4) {
          for (no = 0; no != 5; no = no + 1) {
            iVar4 = xmlMemBlocks();
            iVar2 = (int)in_RSI;
            if (uVar29 == 0) {
              bVar1 = false;
              pcVar16 = "foo";
            }
            else if (uVar29 == 2) {
              bVar1 = false;
              pcVar16 = "test/ent2";
            }
            else if (uVar29 == 1) {
              bVar1 = false;
              pcVar16 = "<foo/>";
            }
            else {
              bVar1 = true;
              pcVar16 = (char *)0x0;
            }
            uVar5 = gen_int(uVar28,iVar2);
            in_RSI = (char *)(ulong)uVar5;
            pcVar19 = gen_filepath(uVar30,iVar2);
            if (uVar26 < 3) {
              uVar15 = (&DAT_0015bd68)[uVar17];
            }
            else {
              uVar15 = 0;
            }
            iVar2 = gen_parseroptions(no,iVar2);
            if (!bVar1) {
              iVar3 = xmlStrlen(pcVar16);
              in_RSI = (char *)(ulong)uVar5;
              if (iVar3 < (int)uVar5) {
                in_RSI = (char *)0x0;
              }
            }
            xmlReaderForMemory(pcVar16,in_RSI,pcVar19,uVar15,iVar2);
            xmlFreeTextReader();
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar4 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlReaderForMemory",(ulong)(uint)(iVar2 - iVar4));
              local_68 = local_68 + 1;
              printf(" %d",(ulong)uVar29);
              printf(" %d",(ulong)uVar28);
              printf(" %d",(ulong)uVar30);
              printf(" %d",uVar17);
              in_RSI = (char *)(ulong)no;
              printf(" %d");
              putchar(10);
            }
          }
          uVar17 = (ulong)(uVar26 + 1);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_6c = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
      uVar17 = 0;
      while (iVar2 = (int)uVar17, iVar2 != 8) {
        uVar21 = 0;
        while (uVar28 = (uint)uVar21, uVar28 != 4) {
          for (uVar30 = 0; uVar30 != 5; uVar30 = uVar30 + 1) {
            iVar3 = xmlMemBlocks();
            iVar6 = (int)in_RSI;
            pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar6);
            in_RSI = (char *)gen_const_xmlChar_ptr(iVar4,iVar6);
            pcVar16 = gen_filepath(iVar2,iVar6);
            if (uVar28 < 3) {
              uVar15 = (&DAT_0015bd68)[uVar21];
            }
            else {
              uVar15 = 0;
            }
            iVar6 = gen_parseroptions(uVar30,iVar6);
            xmlReaderNewDoc(pxVar20,in_RSI,pcVar16,uVar15,iVar6);
            call_tests = call_tests + 1;
            if (pxVar20 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader();
            }
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar3 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlReaderNewDoc",(ulong)(uint)(iVar6 - iVar3));
              local_6c = local_6c + 1;
              printf(" %d",(ulong)uVar29);
              printf(" %d",iVar4);
              printf(" %d",uVar17);
              printf(" %d",uVar21);
              in_RSI = (char *)(ulong)uVar30;
              printf(" %d");
              putchar(10);
            }
          }
          uVar21 = (ulong)(uVar28 + 1);
        }
        uVar17 = (ulong)(iVar2 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    uVar17 = 0;
    while (iVar4 = (int)uVar17, iVar4 != 8) {
      uVar21 = 0;
      while (uVar28 = (uint)uVar21, uVar28 != 4) {
        pxVar23 = (xmlDocPtr)0x0;
        while (iVar2 = (int)pxVar23, iVar2 != 5) {
          iVar3 = xmlMemBlocks();
          iVar6 = (int)in_RSI;
          pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar6);
          in_RSI = gen_filepath(iVar4,iVar6);
          if (uVar28 < 3) {
            uVar15 = (&DAT_0015bd68)[uVar21];
          }
          else {
            uVar15 = 0;
          }
          iVar6 = gen_parseroptions(iVar2,iVar6);
          xmlReaderNewFile(pxVar20,in_RSI,uVar15,iVar6);
          call_tests = call_tests + 1;
          if (pxVar20 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader();
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar3 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlReaderNewFile",(ulong)(uint)(iVar6 - iVar3));
            test_ret_5 = test_ret_5 + 1;
            printf(" %d",(ulong)uVar29);
            printf(" %d",uVar17);
            printf(" %d",uVar21);
            printf(" %d");
            putchar(10);
            in_RSI = (char *)pxVar23;
          }
          pxVar23 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar21 = (ulong)(uVar28 + 1);
      }
      uVar17 = (ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_64 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
      for (uVar28 = 0; uVar28 != 4; uVar28 = uVar28 + 1) {
        for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
          uVar17 = 0;
          while (uVar30 = (uint)uVar17, uVar30 != 4) {
            for (uVar26 = 0; uVar26 != 5; uVar26 = uVar26 + 1) {
              iVar3 = xmlMemBlocks();
              iVar6 = (int)in_RSI;
              pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar6);
              if (iVar4 == 0) {
                bVar1 = false;
                in_RSI = "foo";
              }
              else if (iVar4 == 2) {
                bVar1 = false;
                in_RSI = "test/ent2";
              }
              else if (iVar4 == 1) {
                bVar1 = false;
                in_RSI = "<foo/>";
              }
              else {
                bVar1 = true;
                in_RSI = (char *)0x0;
              }
              iVar7 = gen_int(uVar28,iVar6);
              pcVar16 = gen_filepath(iVar2,iVar6);
              if (uVar30 < 3) {
                uVar15 = (&DAT_0015bd68)[uVar17];
              }
              else {
                uVar15 = 0;
              }
              iVar6 = gen_parseroptions(uVar26,iVar6);
              if ((!bVar1) && (iVar8 = xmlStrlen(in_RSI), iVar8 < iVar7)) {
                iVar7 = 0;
              }
              xmlReaderNewMemory(pxVar20,in_RSI,iVar7,pcVar16,uVar15,iVar6);
              call_tests = call_tests + 1;
              if (pxVar20 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader();
              }
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar3 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlReaderNewMemory",(ulong)(uint)(iVar6 - iVar3))
                ;
                local_64 = local_64 + 1;
                printf(" %d",(ulong)uVar29);
                printf(" %d",iVar4);
                printf(" %d",(ulong)uVar28);
                printf(" %d",iVar2);
                printf(" %d",uVar17);
                in_RSI = (char *)(ulong)uVar26;
                printf(" %d");
                putchar(10);
              }
            }
            uVar17 = (ulong)(uVar30 + 1);
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    pxVar23 = (xmlDocPtr)0x0;
    while (iVar2 = (int)pxVar23, iVar2 != 4) {
      iVar6 = xmlMemBlocks();
      iVar3 = (int)in_RSI;
      pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar3);
      pxVar22 = gen_xmlDocPtr(iVar2,iVar3);
      in_RSI = (char *)pxVar22;
      xmlReaderNewWalker(pxVar20);
      call_tests = call_tests + 1;
      iVar3 = extraout_EDX;
      if (pxVar20 != (xmlTextReaderPtr)0x0) {
        xmlFreeTextReader(pxVar20);
        iVar3 = extraout_EDX_00;
      }
      des_xmlDocPtr((int)pxVar22,(xmlDocPtr)in_RSI,iVar3);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar6 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReaderNewWalker",(ulong)(uint)(iVar3 - iVar6));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        in_RSI = (char *)pxVar23;
      }
      pxVar23 = (xmlDocPtr)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_7 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar23 = gen_xmlDocPtr(uVar29,(int)in_RSI);
    uVar15 = xmlReaderWalker(pxVar23);
    xmlFreeTextReader(uVar15);
    call_tests = call_tests + 1;
    des_xmlDocPtr((int)pxVar23,(xmlDocPtr)in_RSI,nr);
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlReaderWalker",(ulong)(uint)(iVar3 - iVar2));
      test_ret_7 = test_ret_7 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderAttributeCount();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderAttributeCount",(ulong)(uint)(iVar6 - iVar3));
      iVar2 = iVar2 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_84 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    lVar24 = xmlTextReaderBaseUri();
    if (lVar24 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderBaseUri",(ulong)(uint)(iVar6 - iVar3));
      local_84 = local_84 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_88 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderByteConsumed();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderByteConsumed",(ulong)(uint)(iVar6 - iVar3));
      local_88 = local_88 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_8c = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderClose();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderClose",(ulong)(uint)(iVar6 - iVar3));
      local_8c = local_8c + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_90 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderConstBaseUri();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderConstBaseUri",(ulong)(uint)(iVar6 - iVar3));
      local_90 = local_90 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_94 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderConstEncoding();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderConstEncoding",(ulong)(uint)(iVar6 - iVar3));
      local_94 = local_94 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_98 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderConstLocalName();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderConstLocalName",(ulong)(uint)(iVar6 - iVar3));
      local_98 = local_98 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_9c = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderConstName();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderConstName",(ulong)(uint)(iVar6 - iVar3));
      local_9c = local_9c + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_a0 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderConstNamespaceUri();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderConstNamespaceUri",
             (ulong)(uint)(iVar6 - iVar3));
      local_a0 = local_a0 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_a4 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderConstPrefix();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderConstPrefix",(ulong)(uint)(iVar6 - iVar3));
      local_a4 = local_a4 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_f0 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    pxVar23 = (xmlDocPtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar6 = (int)pxVar23;
      if (iVar6 == 5) break;
      iVar7 = xmlMemBlocks();
      pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar3);
      in_RSI = (char *)gen_const_xmlChar_ptr(iVar6,iVar3);
      xmlTextReaderConstString();
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlTextReaderPtr)0x0) {
        xmlFreeTextReader();
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar7 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderConstString",(ulong)(uint)(iVar3 - iVar7));
        local_f0 = local_f0 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        in_RSI = (char *)pxVar23;
      }
      pxVar23 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_a8 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderConstValue();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderConstValue",(ulong)(uint)(iVar6 - iVar3));
      local_a8 = local_a8 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_ac = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderConstXmlLang();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderConstXmlLang",(ulong)(uint)(iVar6 - iVar3));
      local_ac = local_ac + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_b0 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderConstXmlVersion();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderConstXmlVersion",(ulong)(uint)(iVar6 - iVar3))
      ;
      local_b0 = local_b0 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_b4 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    pxVar23 = (xmlDocPtr)xmlTextReaderCurrentDoc(pxVar20);
    desret_xmlDocPtr(pxVar23);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderCurrentDoc",(ulong)(uint)(iVar6 - iVar3));
      local_b4 = local_b4 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_b8 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    pxVar25 = (xmlNodePtr)xmlTextReaderCurrentNode(pxVar20);
    desret_xmlNodePtr(pxVar25);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderCurrentNode",(ulong)(uint)(iVar6 - iVar3));
      local_b8 = local_b8 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_bc = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderDepth();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderDepth",(ulong)(uint)(iVar6 - iVar3));
      local_bc = local_bc + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_34 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    pxVar25 = (xmlNodePtr)xmlTextReaderExpand(pxVar20);
    desret_xmlNodePtr(pxVar25);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderExpand",(ulong)(uint)(iVar6 - iVar3));
      local_34 = local_34 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    pxVar23 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar23;
      if (iVar7 == 5) break;
      iVar8 = xmlMemBlocks();
      pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar6);
      in_RSI = (char *)gen_const_xmlChar_ptr(iVar7,iVar6);
      lVar24 = xmlTextReaderGetAttribute();
      if (lVar24 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlTextReaderPtr)0x0) {
        xmlFreeTextReader();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar8 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderGetAttribute",(ulong)(uint)(iVar6 - iVar8));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        in_RSI = (char *)pxVar23;
      }
      pxVar23 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    pxVar23 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar23;
      if (iVar7 == 4) break;
      iVar8 = xmlMemBlocks();
      pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar6);
      uVar28 = gen_int(iVar7,iVar6);
      in_RSI = (char *)(ulong)uVar28;
      lVar24 = xmlTextReaderGetAttributeNo();
      if (lVar24 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlTextReaderPtr)0x0) {
        xmlFreeTextReader();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar8 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderGetAttributeNo",(ulong)(uint)(iVar6 - iVar8)
              );
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        in_RSI = (char *)pxVar23;
      }
      pxVar23 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    uVar17 = 0;
    while (iVar7 = (int)uVar17, iVar7 != 5) {
      pxVar23 = (xmlDocPtr)0x0;
      while( true ) {
        iVar8 = (int)in_RSI;
        iVar10 = (int)pxVar23;
        if (iVar10 == 5) break;
        iVar9 = xmlMemBlocks();
        pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar8);
        in_RSI = (char *)gen_const_xmlChar_ptr(iVar7,iVar8);
        pxVar18 = gen_const_xmlChar_ptr(iVar10,iVar8);
        lVar24 = xmlTextReaderGetAttributeNs(pxVar20,in_RSI,pxVar18);
        if (lVar24 != 0) {
          (*_xmlFree)();
        }
        call_tests = call_tests + 1;
        if (pxVar20 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader();
        }
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar9 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderGetAttributeNs",
                 (ulong)(uint)(iVar8 - iVar9));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar29);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = (char *)pxVar23;
        }
        pxVar23 = (xmlDocPtr)(ulong)(iVar10 + 1);
      }
      uVar17 = (ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_ec = 0;
  for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
    bVar1 = true;
    while (bVar1) {
      bVar1 = true;
      while (iVar8 = (int)in_RSI, bVar1) {
        iVar10 = xmlMemBlocks();
        pxVar20 = gen_xmlTextReaderPtr(iVar7,iVar8);
        in_RSI = (char *)0x0;
        xmlTextReaderGetErrorHandler(pxVar20,0,0);
        call_tests = call_tests + 1;
        if (pxVar20 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader();
        }
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar10 == iVar8) break;
        iVar8 = xmlMemBlocks();
        bVar1 = false;
        printf("Leak of %d blocks found in xmlTextReaderGetErrorHandler",
               (ulong)(uint)(iVar8 - iVar10));
        local_ec = local_ec + 1;
        printf(" %d");
        printf(" %d");
        in_RSI = (char *)0x0;
        printf(" %d");
        putchar(10);
      }
      bVar1 = false;
    }
  }
  function_tests = function_tests + 1;
  local_38 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar7 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderGetParserColumnNumber();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderGetParserColumnNumber",
             (ulong)(uint)(iVar8 - iVar7));
      local_38 = local_38 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar7 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderGetParserLineNumber();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderGetParserLineNumber",
             (ulong)(uint)(iVar8 - iVar7));
      local_3c = local_3c + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    pxVar23 = (xmlDocPtr)0x0;
    while( true ) {
      iVar8 = (int)in_RSI;
      iVar10 = (int)pxVar23;
      if (iVar10 == 4) break;
      iVar9 = xmlMemBlocks();
      pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar8);
      uVar28 = gen_int(iVar10,iVar8);
      in_RSI = (char *)(ulong)uVar28;
      xmlTextReaderGetParserProp();
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlTextReaderPtr)0x0) {
        xmlFreeTextReader();
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar9 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderGetParserProp",(ulong)(uint)(iVar8 - iVar9))
        ;
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        in_RSI = (char *)pxVar23;
      }
      pxVar23 = (xmlDocPtr)(ulong)(iVar10 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_40 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar8 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderGetRemainder(pxVar20);
    xmlFreeParserInputBuffer();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar8 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderGetRemainder",(ulong)(uint)(iVar10 - iVar8));
      local_40 = local_40 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar8 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderHasAttributes();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar8 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderHasAttributes",(ulong)(uint)(iVar10 - iVar8));
      local_44 = local_44 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_cc = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar8 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderHasValue();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar8 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderHasValue",(ulong)(uint)(iVar10 - iVar8));
      local_cc = local_cc + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_48 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar8 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderIsDefault();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar8 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderIsDefault",(ulong)(uint)(iVar10 - iVar8));
      local_48 = local_48 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_4c = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar8 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderIsEmptyElement();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar8 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderIsEmptyElement",(ulong)(uint)(iVar10 - iVar8))
      ;
      local_4c = local_4c + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar8 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar10 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderIsNamespaceDecl();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar10 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderIsNamespaceDecl",(ulong)(uint)(iVar9 - iVar10)
            );
      iVar8 = iVar8 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar10 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar9 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderIsValid();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar9 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderIsValid",(ulong)(uint)(iVar11 - iVar9));
      iVar10 = iVar10 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar9 = 0;
  pxVar23 = (xmlDocPtr)0x0;
  while (iVar11 = (int)pxVar23, iVar11 != 4) {
    iVar12 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(iVar11,(int)in_RSI);
    lVar24 = xmlTextReaderLocalName();
    if (lVar24 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader();
    }
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderLocalName",(ulong)(uint)(iVar13 - iVar12));
      iVar9 = iVar9 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = (char *)pxVar23;
    }
    pxVar23 = (xmlDocPtr)(ulong)(iVar11 + 1);
  }
  function_tests = function_tests + 1;
  local_cc = -(local_cc + local_48 + local_4c + iVar8 + iVar10 + iVar9 +
              test_ret_1 + iVar6 + local_ec + local_38 + local_3c + iVar7 + local_40 + local_44 +
              local_ac + local_b0 + local_b4 + local_b8 + local_bc + local_34 + iVar3 +
              local_98 + local_9c + local_a0 + local_a4 + local_f0 + local_a8 +
              local_84 + local_88 + local_8c + local_90 + local_94 +
              local_64 + iVar4 + test_ret_7 + iVar2 +
              local_68 + local_6c + test_ret_5 + local_70 + local_78 + test_ret_6 + test_ret);
  bVar1 = true;
  while (bVar1) {
    iVar4 = xmlMemBlocks();
    lVar24 = xmlTextReaderLocatorBaseURI(0);
    if (lVar24 != 0) {
      (*_xmlFree)(lVar24);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar4 == iVar2) break;
    xmlMemBlocks();
    bVar1 = false;
    printf("Leak of %d blocks found in xmlTextReaderLocatorBaseURI");
    in_RSI = (char *)0x0;
    printf(" %d");
    putchar(10);
    local_cc = local_cc + -1;
  }
  function_tests = function_tests + 1;
  bVar1 = true;
  while (bVar1) {
    iVar4 = xmlMemBlocks();
    xmlTextReaderLocatorLineNumber(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar4 == iVar2) break;
    xmlMemBlocks();
    bVar1 = false;
    printf("Leak of %d blocks found in xmlTextReaderLocatorLineNumber");
    in_RSI = (char *)0x0;
    printf(" %d");
    putchar(10);
    local_cc = local_cc + -1;
  }
  function_tests = function_tests + 1;
  local_6c = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    pxVar23 = (xmlDocPtr)0x0;
    while( true ) {
      iVar4 = (int)in_RSI;
      iVar2 = (int)pxVar23;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar4);
      in_RSI = (char *)gen_const_xmlChar_ptr(iVar2,iVar4);
      lVar24 = xmlTextReaderLookupNamespace(pxVar20);
      if (lVar24 != 0) {
        (*_xmlFree)(lVar24);
      }
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlTextReaderPtr)0x0) {
        xmlFreeTextReader(pxVar20);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderLookupNamespace",
               (ulong)(uint)(iVar4 - iVar3));
        local_6c = local_6c + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        in_RSI = (char *)pxVar23;
      }
      pxVar23 = (xmlDocPtr)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_70 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    pxVar23 = (xmlDocPtr)0x0;
    while( true ) {
      iVar4 = (int)in_RSI;
      iVar2 = (int)pxVar23;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar4);
      in_RSI = (char *)gen_const_xmlChar_ptr(iVar2,iVar4);
      xmlTextReaderMoveToAttribute(pxVar20);
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlTextReaderPtr)0x0) {
        xmlFreeTextReader(pxVar20);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderMoveToAttribute",
               (ulong)(uint)(iVar4 - iVar3));
        local_70 = local_70 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        in_RSI = (char *)pxVar23;
      }
      pxVar23 = (xmlDocPtr)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    pxVar23 = (xmlDocPtr)0x0;
    while( true ) {
      iVar4 = (int)in_RSI;
      iVar2 = (int)pxVar23;
      if (iVar2 == 4) break;
      iVar3 = xmlMemBlocks();
      pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar4);
      uVar28 = gen_int(iVar2,iVar4);
      in_RSI = (char *)(ulong)uVar28;
      xmlTextReaderMoveToAttributeNo(pxVar20);
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlTextReaderPtr)0x0) {
        xmlFreeTextReader(pxVar20);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderMoveToAttributeNo",
               (ulong)(uint)(iVar4 - iVar3));
        test_ret_5 = test_ret_5 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        in_RSI = (char *)pxVar23;
      }
      pxVar23 = (xmlDocPtr)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    uVar17 = 0;
    while (iVar2 = (int)uVar17, iVar2 != 5) {
      pxVar23 = (xmlDocPtr)0x0;
      while( true ) {
        iVar3 = (int)in_RSI;
        iVar6 = (int)pxVar23;
        if (iVar6 == 5) break;
        iVar7 = xmlMemBlocks();
        pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar3);
        in_RSI = (char *)gen_const_xmlChar_ptr(iVar2,iVar3);
        pxVar18 = gen_const_xmlChar_ptr(iVar6,iVar3);
        xmlTextReaderMoveToAttributeNs(pxVar20,in_RSI,pxVar18);
        call_tests = call_tests + 1;
        if (pxVar20 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar20);
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar7 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderMoveToAttributeNs",
                 (ulong)(uint)(iVar3 - iVar7));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar29);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = (char *)pxVar23;
        }
        pxVar23 = (xmlDocPtr)(ulong)(iVar6 + 1);
      }
      uVar17 = (ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_84 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderMoveToElement(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderMoveToElement",(ulong)(uint)(iVar3 - iVar2));
      local_84 = local_84 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_88 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderMoveToFirstAttribute(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderMoveToFirstAttribute",
             (ulong)(uint)(iVar3 - iVar2));
      local_88 = local_88 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_8c = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderMoveToNextAttribute(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderMoveToNextAttribute",
             (ulong)(uint)(iVar3 - iVar2));
      local_8c = local_8c + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_90 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    lVar24 = xmlTextReaderName(pxVar20);
    if (lVar24 != 0) {
      (*_xmlFree)(lVar24);
    }
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderName",(ulong)(uint)(iVar3 - iVar2));
      local_90 = local_90 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_94 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    lVar24 = xmlTextReaderNamespaceUri(pxVar20);
    if (lVar24 != 0) {
      (*_xmlFree)(lVar24);
    }
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderNamespaceUri",(ulong)(uint)(iVar3 - iVar2));
      local_94 = local_94 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_98 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderNext(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderNext",(ulong)(uint)(iVar3 - iVar2));
      local_98 = local_98 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_9c = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderNextSibling(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderNextSibling",(ulong)(uint)(iVar3 - iVar2));
      local_9c = local_9c + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_a0 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderNodeType(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderNodeType",(ulong)(uint)(iVar3 - iVar2));
      local_a0 = local_a0 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_a4 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderNormalization(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderNormalization",(ulong)(uint)(iVar3 - iVar2));
      local_a4 = local_a4 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_a8 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    lVar24 = xmlTextReaderPrefix(pxVar20);
    if (lVar24 != 0) {
      (*_xmlFree)(lVar24);
    }
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderPrefix",(ulong)(uint)(iVar3 - iVar2));
      local_a8 = local_a8 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_ac = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    pxVar25 = (xmlNodePtr)xmlTextReaderPreserve(pxVar20);
    desret_xmlNodePtr(pxVar25);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderPreserve",(ulong)(uint)(iVar3 - iVar2));
      local_ac = local_ac + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_68 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    for (iVar2 = 0; iVar2 != 5; iVar2 = iVar2 + 1) {
      bVar1 = true;
      while (iVar3 = (int)in_RSI, bVar1) {
        iVar6 = xmlMemBlocks();
        pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar3);
        in_RSI = (char *)gen_const_xmlChar_ptr(iVar2,iVar3);
        xmlTextReaderPreservePattern(pxVar20,in_RSI,0);
        call_tests = call_tests + 1;
        if (pxVar20 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar20);
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar6 == iVar3) break;
        iVar3 = xmlMemBlocks();
        bVar1 = false;
        printf("Leak of %d blocks found in xmlTextReaderPreservePattern",
               (ulong)(uint)(iVar3 - iVar6));
        local_68 = local_68 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        in_RSI = (char *)0x0;
        printf(" %d");
        putchar(10);
      }
    }
  }
  function_tests = function_tests + 1;
  local_b0 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderQuoteChar(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderQuoteChar",(ulong)(uint)(iVar3 - iVar2));
      local_b0 = local_b0 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_b4 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderRead(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderRead",(ulong)(uint)(iVar3 - iVar2));
      local_b4 = local_b4 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_b8 = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderReadAttributeValue(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderReadAttributeValue",
             (ulong)(uint)(iVar3 - iVar2));
      local_b8 = local_b8 + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_bc = 0;
  for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
    xmlTextReaderReadState(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlTextReaderPtr)0x0) {
      xmlFreeTextReader(pxVar20);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlTextReaderReadState",(ulong)(uint)(iVar3 - iVar2));
      local_bc = local_bc + 1;
      in_RSI = (char *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  test_ret_6 = 0;
  do {
    if (iVar2 == 4) {
      function_tests = function_tests + 1;
      local_78 = 0;
      for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
        pxVar23 = (xmlDocPtr)0x0;
        puVar27 = &DAT_0015bd68;
        while( true ) {
          iVar2 = (int)in_RSI;
          uVar28 = (uint)pxVar23;
          if (uVar28 == 4) break;
          iVar3 = xmlMemBlocks();
          pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar2);
          if (uVar28 < 3) {
            in_RSI = (char *)*puVar27;
          }
          else {
            in_RSI = (char *)0x0;
          }
          xmlTextReaderRelaxNGValidate(pxVar20);
          call_tests = call_tests + 1;
          if (pxVar20 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar20);
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar3 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderRelaxNGValidate",
                   (ulong)(uint)(iVar2 - iVar3));
            local_78 = local_78 + 1;
            printf(" %d",(ulong)uVar29);
            printf(" %d");
            putchar(10);
            in_RSI = (char *)pxVar23;
          }
          pxVar23 = (xmlDocPtr)(ulong)(uVar28 + 1);
          puVar27 = puVar27 + 1;
        }
      }
      function_tests = function_tests + 1;
      test_ret_7 = 0;
      for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
        bVar1 = true;
        while (bVar1) {
          pxVar23 = (xmlDocPtr)0x0;
          while( true ) {
            iVar2 = (int)in_RSI;
            iVar3 = (int)pxVar23;
            if (iVar3 == 5) break;
            iVar6 = xmlMemBlocks();
            pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar2);
            iVar2 = gen_parseroptions(iVar3,iVar2);
            in_RSI = (char *)0x0;
            xmlTextReaderRelaxNGValidateCtxt(pxVar20,0,iVar2);
            call_tests = call_tests + 1;
            if (pxVar20 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar20);
            }
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar6 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderRelaxNGValidateCtxt",
                     (ulong)(uint)(iVar2 - iVar6));
              test_ret_7 = test_ret_7 + 1;
              printf(" %d",(ulong)uVar29);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = (char *)pxVar23;
            }
            pxVar23 = (xmlDocPtr)(ulong)(iVar3 + 1);
          }
          bVar1 = false;
        }
      }
      function_tests = function_tests + 1;
      for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
        puVar27 = &DAT_0015bd68;
        for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
          pxVar20 = gen_xmlTextReaderPtr(iVar2,(int)in_RSI);
          if (uVar29 < 3) {
            in_RSI = (char *)*puVar27;
          }
          else {
            in_RSI = (char *)0x0;
          }
          xmlTextReaderSchemaValidate(pxVar20);
          call_tests = call_tests + 1;
          if (pxVar20 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar20);
          }
          xmlResetLastError();
          puVar27 = puVar27 + 1;
        }
      }
      function_tests = function_tests + 1;
      iVar2 = 0;
      for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
        bVar1 = true;
        while (bVar1) {
          pxVar23 = (xmlDocPtr)0x0;
          while( true ) {
            iVar3 = (int)in_RSI;
            iVar6 = (int)pxVar23;
            if (iVar6 == 5) break;
            iVar7 = xmlMemBlocks();
            pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar3);
            iVar3 = gen_parseroptions(iVar6,iVar3);
            in_RSI = (char *)0x0;
            xmlTextReaderSchemaValidateCtxt(pxVar20,0,iVar3);
            call_tests = call_tests + 1;
            if (pxVar20 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar20);
            }
            xmlResetLastError();
            iVar3 = xmlMemBlocks();
            if (iVar7 != iVar3) {
              iVar3 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderSchemaValidateCtxt",
                     (ulong)(uint)(iVar3 - iVar7));
              iVar2 = iVar2 + 1;
              printf(" %d",(ulong)uVar29);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = (char *)pxVar23;
            }
            pxVar23 = (xmlDocPtr)(ulong)(iVar6 + 1);
          }
          bVar1 = false;
        }
      }
      function_tests = function_tests + 1;
      local_64 = 0;
      for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
        uVar17 = 0;
        while (iVar3 = (int)uVar17, iVar3 != 4) {
          pxVar23 = (xmlDocPtr)0x0;
          while( true ) {
            iVar6 = (int)in_RSI;
            iVar7 = (int)pxVar23;
            if (iVar7 == 4) break;
            iVar8 = xmlMemBlocks();
            pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar6);
            uVar28 = gen_int(iVar3,iVar6);
            iVar6 = gen_int(iVar7,iVar6);
            in_RSI = (char *)(ulong)uVar28;
            xmlTextReaderSetParserProp(pxVar20,in_RSI,iVar6);
            call_tests = call_tests + 1;
            if (pxVar20 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar20);
            }
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar8 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderSetParserProp",
                     (ulong)(uint)(iVar6 - iVar8));
              local_64 = local_64 + 1;
              printf(" %d",(ulong)uVar29);
              printf(" %d",uVar17);
              printf(" %d");
              putchar(10);
              in_RSI = (char *)pxVar23;
            }
            pxVar23 = (xmlDocPtr)(ulong)(iVar7 + 1);
          }
          uVar17 = (ulong)(iVar3 + 1);
        }
      }
      function_tests = function_tests + 1;
      iVar3 = 0;
      test_ret = 0;
      do {
        if (iVar3 == 4) {
          function_tests = function_tests + 1;
          test_ret_1 = 0;
          for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
            for (iVar3 = 0; iVar3 != 8; iVar3 = iVar3 + 1) {
              uVar17 = 0;
              while (iVar6 = (int)uVar17, iVar6 != 8) {
                for (uVar28 = 0; uVar28 != 4; uVar28 = uVar28 + 1) {
                  pxVar23 = (xmlDocPtr)0x0;
                  while( true ) {
                    iVar8 = (int)in_RSI;
                    iVar7 = (int)pxVar23;
                    if (iVar7 == 5) break;
                    iVar10 = xmlMemBlocks();
                    pxVar20 = gen_xmlTextReaderPtr(uVar29,iVar8);
                    in_RSI = (char *)gen_xmlParserInputBufferPtr(iVar3,iVar8);
                    pcVar16 = gen_filepath(iVar6,iVar8);
                    if (uVar28 < 3) {
                      uVar15 = (&DAT_0015bd68)[uVar28];
                    }
                    else {
                      uVar15 = 0;
                    }
                    iVar8 = gen_parseroptions(iVar7,iVar8);
                    xmlTextReaderSetup(pxVar20,in_RSI,pcVar16,uVar15,iVar8);
                    call_tests = call_tests + 1;
                    if (pxVar20 != (xmlTextReaderPtr)0x0) {
                      xmlFreeTextReader(pxVar20);
                    }
                    xmlResetLastError();
                    iVar8 = xmlMemBlocks();
                    if (iVar10 != iVar8) {
                      iVar8 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlTextReaderSetup",
                             (ulong)(uint)(iVar8 - iVar10));
                      test_ret_1 = test_ret_1 + 1;
                      printf(" %d",(ulong)uVar29);
                      printf(" %d",iVar3);
                      printf(" %d",uVar17);
                      printf(" %d",(ulong)uVar28);
                      printf(" %d");
                      putchar(10);
                      in_RSI = (char *)pxVar23;
                    }
                    pxVar23 = (xmlDocPtr)(ulong)(iVar7 + 1);
                  }
                }
                uVar17 = (ulong)(iVar6 + 1);
              }
            }
          }
          function_tests = function_tests + 1;
          iVar3 = 0;
          for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
            iVar6 = xmlMemBlocks();
            pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
            xmlTextReaderStandalone(pxVar20);
            call_tests = call_tests + 1;
            if (pxVar20 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar20);
            }
            xmlResetLastError();
            iVar7 = xmlMemBlocks();
            if (iVar6 != iVar7) {
              iVar7 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderStandalone",
                     (ulong)(uint)(iVar7 - iVar6));
              iVar3 = iVar3 + 1;
              in_RSI = (char *)(ulong)uVar29;
              printf(" %d");
              putchar(10);
            }
          }
          function_tests = function_tests + 1;
          iVar6 = 0;
          for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
            iVar7 = xmlMemBlocks();
            pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
            lVar24 = xmlTextReaderValue(pxVar20);
            if (lVar24 != 0) {
              (*_xmlFree)(lVar24);
            }
            call_tests = call_tests + 1;
            if (pxVar20 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar20);
            }
            xmlResetLastError();
            iVar8 = xmlMemBlocks();
            if (iVar7 != iVar8) {
              iVar8 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderValue",(ulong)(uint)(iVar8 - iVar7));
              iVar6 = iVar6 + 1;
              in_RSI = (char *)(ulong)uVar29;
              printf(" %d");
              putchar(10);
            }
          }
          function_tests = function_tests + 1;
          iVar7 = 0;
          for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
            iVar8 = xmlMemBlocks();
            pxVar20 = gen_xmlTextReaderPtr(uVar29,(int)in_RSI);
            lVar24 = xmlTextReaderXmlLang(pxVar20);
            if (lVar24 != 0) {
              (*_xmlFree)(lVar24);
            }
            call_tests = call_tests + 1;
            if (pxVar20 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar20);
            }
            xmlResetLastError();
            iVar10 = xmlMemBlocks();
            if (iVar8 != iVar10) {
              iVar10 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderXmlLang",(ulong)(uint)(iVar10 - iVar8)
                    );
              iVar7 = iVar7 + 1;
              in_RSI = (char *)(ulong)uVar29;
              printf(" %d");
              putchar(10);
            }
          }
          function_tests = function_tests + 1;
          iVar7 = test_ret_7 + iVar2 + local_64 + test_ret + test_ret_1 + iVar3 + iVar6 +
                  local_b0 + local_b4 + local_b8 + local_bc + test_ret_6 + local_78 +
                  local_a0 + local_a4 + local_a8 + local_ac + local_68 +
                  local_90 + local_94 + local_98 + local_9c +
                  local_84 + local_88 + local_8c + test_ret_5 + iVar4 + local_6c + local_70 + iVar7;
          uVar29 = -(local_cc - iVar7);
          if (local_cc != iVar7) {
            printf("Module xmlreader: %d errors\n",(ulong)uVar29);
          }
          return uVar29;
        }
        bVar1 = true;
        while (iVar6 = (int)in_RSI, bVar1) {
          iVar7 = xmlMemBlocks();
          pxVar20 = gen_xmlTextReaderPtr(iVar3,iVar6);
          in_RSI = (char *)0x0;
          xmlTextReaderSetSchema(pxVar20);
          call_tests = call_tests + 1;
          if (pxVar20 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar20);
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar7 == iVar6) break;
          iVar6 = xmlMemBlocks();
          bVar1 = false;
          printf("Leak of %d blocks found in xmlTextReaderSetSchema",(ulong)(uint)(iVar6 - iVar7));
          test_ret = test_ret + 1;
          printf(" %d");
          in_RSI = (char *)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar3 = iVar3 + 1;
      } while( true );
    }
    bVar1 = true;
    while (iVar3 = (int)in_RSI, bVar1) {
      iVar6 = xmlMemBlocks();
      pxVar20 = gen_xmlTextReaderPtr(iVar2,iVar3);
      in_RSI = (char *)0x0;
      xmlTextReaderRelaxNGSetSchema(pxVar20);
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlTextReaderPtr)0x0) {
        xmlFreeTextReader(pxVar20);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar6 == iVar3) break;
      iVar3 = xmlMemBlocks();
      bVar1 = false;
      printf("Leak of %d blocks found in xmlTextReaderRelaxNGSetSchema",(ulong)(uint)(iVar3 - iVar6)
            );
      test_ret_6 = test_ret_6 + 1;
      printf(" %d");
      in_RSI = (char *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static int
test_xmlreader(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlreader : 76 of 89 functions ...\n");
    test_ret += test_xmlNewTextReader();
    test_ret += test_xmlNewTextReaderFilename();
    test_ret += test_xmlReaderForDoc();
    test_ret += test_xmlReaderForFile();
    test_ret += test_xmlReaderForMemory();
    test_ret += test_xmlReaderNewDoc();
    test_ret += test_xmlReaderNewFile();
    test_ret += test_xmlReaderNewMemory();
    test_ret += test_xmlReaderNewWalker();
    test_ret += test_xmlReaderWalker();
    test_ret += test_xmlTextReaderAttributeCount();
    test_ret += test_xmlTextReaderBaseUri();
    test_ret += test_xmlTextReaderByteConsumed();
    test_ret += test_xmlTextReaderClose();
    test_ret += test_xmlTextReaderConstBaseUri();
    test_ret += test_xmlTextReaderConstEncoding();
    test_ret += test_xmlTextReaderConstLocalName();
    test_ret += test_xmlTextReaderConstName();
    test_ret += test_xmlTextReaderConstNamespaceUri();
    test_ret += test_xmlTextReaderConstPrefix();
    test_ret += test_xmlTextReaderConstString();
    test_ret += test_xmlTextReaderConstValue();
    test_ret += test_xmlTextReaderConstXmlLang();
    test_ret += test_xmlTextReaderConstXmlVersion();
    test_ret += test_xmlTextReaderCurrentDoc();
    test_ret += test_xmlTextReaderCurrentNode();
    test_ret += test_xmlTextReaderDepth();
    test_ret += test_xmlTextReaderExpand();
    test_ret += test_xmlTextReaderGetAttribute();
    test_ret += test_xmlTextReaderGetAttributeNo();
    test_ret += test_xmlTextReaderGetAttributeNs();
    test_ret += test_xmlTextReaderGetErrorHandler();
    test_ret += test_xmlTextReaderGetLastError();
    test_ret += test_xmlTextReaderGetParserColumnNumber();
    test_ret += test_xmlTextReaderGetParserLineNumber();
    test_ret += test_xmlTextReaderGetParserProp();
    test_ret += test_xmlTextReaderGetRemainder();
    test_ret += test_xmlTextReaderHasAttributes();
    test_ret += test_xmlTextReaderHasValue();
    test_ret += test_xmlTextReaderIsDefault();
    test_ret += test_xmlTextReaderIsEmptyElement();
    test_ret += test_xmlTextReaderIsNamespaceDecl();
    test_ret += test_xmlTextReaderIsValid();
    test_ret += test_xmlTextReaderLocalName();
    test_ret += test_xmlTextReaderLocatorBaseURI();
    test_ret += test_xmlTextReaderLocatorLineNumber();
    test_ret += test_xmlTextReaderLookupNamespace();
    test_ret += test_xmlTextReaderMoveToAttribute();
    test_ret += test_xmlTextReaderMoveToAttributeNo();
    test_ret += test_xmlTextReaderMoveToAttributeNs();
    test_ret += test_xmlTextReaderMoveToElement();
    test_ret += test_xmlTextReaderMoveToFirstAttribute();
    test_ret += test_xmlTextReaderMoveToNextAttribute();
    test_ret += test_xmlTextReaderName();
    test_ret += test_xmlTextReaderNamespaceUri();
    test_ret += test_xmlTextReaderNext();
    test_ret += test_xmlTextReaderNextSibling();
    test_ret += test_xmlTextReaderNodeType();
    test_ret += test_xmlTextReaderNormalization();
    test_ret += test_xmlTextReaderPrefix();
    test_ret += test_xmlTextReaderPreserve();
    test_ret += test_xmlTextReaderPreservePattern();
    test_ret += test_xmlTextReaderQuoteChar();
    test_ret += test_xmlTextReaderRead();
    test_ret += test_xmlTextReaderReadAttributeValue();
    test_ret += test_xmlTextReaderReadState();
    test_ret += test_xmlTextReaderRelaxNGSetSchema();
    test_ret += test_xmlTextReaderRelaxNGValidate();
    test_ret += test_xmlTextReaderRelaxNGValidateCtxt();
    test_ret += test_xmlTextReaderSchemaValidate();
    test_ret += test_xmlTextReaderSchemaValidateCtxt();
    test_ret += test_xmlTextReaderSetErrorHandler();
    test_ret += test_xmlTextReaderSetMaxAmplification();
    test_ret += test_xmlTextReaderSetParserProp();
    test_ret += test_xmlTextReaderSetResourceLoader();
    test_ret += test_xmlTextReaderSetSchema();
    test_ret += test_xmlTextReaderSetStructuredErrorHandler();
    test_ret += test_xmlTextReaderSetup();
    test_ret += test_xmlTextReaderStandalone();
    test_ret += test_xmlTextReaderValue();
    test_ret += test_xmlTextReaderXmlLang();

    if (test_ret != 0)
	printf("Module xmlreader: %d errors\n", test_ret);
    return(test_ret);
}